

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.h
# Opt level: O2

RecyclerTestObject * Location::Tag(RecyclerTestObject *untagged)

{
  RecyclerTestObject *pRVar1;
  
  if (untagged == (RecyclerTestObject *)0x0) {
    pRVar1 = (RecyclerTestObject *)0x0;
  }
  else {
    DoVerify(((ulong)untagged & 1) == 0,"(value & 0x1) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/GCStress/GCStress.h"
             ,0xb9);
    pRVar1 = (RecyclerTestObject *)((ulong)untagged | 1);
  }
  return pRVar1;
}

Assistant:

static RecyclerTestObject * Tag(RecyclerTestObject * untagged)
    {
        if (untagged == nullptr)
        {
            return nullptr;
        }
        else
        {
            size_t value = (size_t)untagged;
            VerifyCondition((value & 0x1) == 0);
            value |= 0x1;
            return (RecyclerTestObject *)value;
        }
    }